

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

TestAllTypes_NestedMessage * __thiscall
proto2_unittest::TestAllTypes::_internal_mutable_oneof_lazy_nested_message(TestAllTypes *this)

{
  TestAllTypes_NestedMessage *pTVar1;
  Arena *arena;
  
  if ((this->field_0)._impl_._oneof_case_[0] == 0x75) {
    pTVar1 = (this->field_0)._impl_.oneof_field_.oneof_nested_message_;
  }
  else {
    clear_oneof_field(this);
    (this->field_0)._impl_._oneof_case_[0] = 0x75;
    arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pTVar1 = (TestAllTypes_NestedMessage *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>
                       (arena);
    (this->field_0)._impl_.oneof_field_.oneof_nested_message_ = pTVar1;
  }
  return pTVar1;
}

Assistant:

TestAllTypes::_internal_mutable_oneof_lazy_nested_message() {
  if (oneof_field_case() != kOneofLazyNestedMessage) {
    clear_oneof_field();
    set_has_oneof_lazy_nested_message();
    _impl_.oneof_field_.oneof_lazy_nested_message_ = 
        ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestAllTypes_NestedMessage>(GetArena());
  }
  return _impl_.oneof_field_.oneof_lazy_nested_message_;
}